

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::TemplatedWritePlain<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  long local_write [2048];
  ulong local_4028 [2048];
  
  if (stats < chunk_start) {
    lVar1 = 0;
    do {
      local_4028[lVar1] = *(ulong *)(&col->vector_type + (long)stats * 8) >> 0x18;
      lVar1 = lVar1 + 1;
      if (lVar1 == 0x800) {
        (*(code *)**(undefined8 **)chunk_end)(chunk_end,local_4028,0x4000);
        lVar1 = 0;
      }
      stats = (ColumnWriterStatistics *)((long)&stats->_vptr_ColumnWriterStatistics + 1);
    } while ((ColumnWriterStatistics *)chunk_start != stats);
    lVar1 = lVar1 << 3;
  }
  else {
    lVar1 = 0;
  }
  (*(code *)**(undefined8 **)chunk_end)(chunk_end,local_4028,lVar1);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}